

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O1

Expression __thiscall
cnn::DeepLSTMBuilder::add_input_impl(DeepLSTMBuilder *this,int prev,Expression *x)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  DeepLSTMBuilder *pDVar4;
  long lVar5;
  long *in_RCX;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  undefined8 extraout_RDX;
  ComputationGraph *pCVar10;
  undefined4 in_register_00000034;
  long lVar11;
  long lVar12;
  VariableIndex VVar13;
  bool bVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  Expression EVar15;
  Expression i_aot;
  Expression i_ot;
  Expression i_ait;
  Expression ph_t;
  Expression i_wt;
  Expression i_it;
  Expression i_ft;
  Expression i_awt;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> cc;
  undefined1 local_1c8 [8];
  ulong local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  VariableIndex local_1a8;
  pointer local_1a0;
  undefined4 local_198;
  ComputationGraph *local_190;
  uint local_188;
  ExecutionEngine *local_180;
  undefined4 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_160;
  undefined4 local_158;
  ComputationGraph *local_150;
  uint local_148;
  uint local_13c;
  long local_138;
  undefined8 local_130;
  ulong local_128;
  long local_120;
  undefined1 local_118 [8];
  ulong local_110;
  Expression local_108;
  initializer_list<cnn::expr::Expression> local_f8;
  Expression local_e8;
  Expression local_d8;
  Expression local_c8;
  initializer_list<cnn::expr::Expression> local_b8;
  ComputationGraph *local_a8;
  uint local_a0;
  long *local_98;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_90;
  long local_78;
  DeepLSTMBuilder *local_70;
  long *local_68;
  long *local_60;
  long local_58;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_50;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_48;
  long local_40;
  ulong local_38;
  undefined8 uVar9;
  
  lVar5 = CONCAT44(in_register_00000034,prev);
  local_13c = (uint)x;
  local_98 = in_RCX;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_1b0,
             (ulong)*(uint *)(lVar5 + 0xd8),(allocator_type *)&local_90);
  local_48 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x58);
  local_138 = lVar5;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_48,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_1b0);
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0);
  }
  lVar5 = local_138;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_1b0,
             (ulong)*(uint *)(local_138 + 0xd8),(allocator_type *)&local_90);
  local_50 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar5 + 0x70);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_50,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_1b0);
  local_70 = this;
  if (local_1b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b0);
  }
  lVar5 = local_138;
  local_1b0 = (undefined1  [8])0x0;
  local_1a8.t = 0;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
  emplace_back<cnn::expr::Expression>
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             (local_138 + 0x88),(Expression *)local_1b0);
  local_40 = *(long *)(lVar5 + 0x60);
  local_120 = *(long *)(lVar5 + 0x78);
  local_78 = *(long *)(lVar5 + 0x90);
  pCVar10 = (ComputationGraph *)*local_98;
  VVar13.t = *(uint *)(local_98 + 1);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_90,(ulong)*(uint *)(lVar5 + 0xd8),(allocator_type *)local_1b0);
  if (*(int *)(lVar5 + 0xd8) != 0) {
    local_60 = (long *)(lVar5 + 0xa8);
    local_68 = (long *)(lVar5 + 0xc0);
    lVar12 = 0;
    local_58 = (ulong)local_13c << 3;
    lVar11 = 0;
    uVar7 = 0;
    do {
      local_38 = uVar7;
      if (lVar11 != 0) {
        local_1a0 = (pointer)*local_98;
        local_198 = (undefined4)local_98[1];
        local_118 = (undefined1  [8])local_1b0;
        local_110 = 2;
        local_1b0 = (undefined1  [8])pCVar10;
        local_1a8.t = VVar13.t;
        expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_108,(initializer_list<cnn::expr::Expression> *)local_118);
        pCVar10 = local_108.pg;
        VVar13.t = local_108.i.t;
      }
      local_1b8 = *(long *)(lVar5 + 0x40);
      local_108.pg = (ComputationGraph *)0x0;
      local_108.i.t = 0;
      bVar1 = *(byte *)(lVar5 + 0xa0);
      bVar14 = (int)local_13c < 0;
      if (bVar14) {
        plVar6 = local_68;
        plVar8 = local_60;
        if ((bVar1 & 1) != 0) goto LAB_0018c5e0;
        local_128 = 0;
        local_130 = 0;
      }
      else {
        plVar6 = (long *)(local_58 * 3 + *(long *)local_50);
        plVar8 = (long *)(*(long *)local_48 + local_58 * 3);
LAB_0018c5e0:
        local_130 = *(undefined8 *)(*plVar8 + lVar11);
        local_128 = (ulong)*(uint *)(*plVar8 + 8 + lVar11);
        local_108.pg = *(ComputationGraph **)(*plVar6 + lVar11);
        local_108.i.t = *(uint *)(*plVar6 + 8 + lVar11);
      }
      local_118 = (undefined1  [8])0x0;
      local_110 = local_110 & 0xffffffff00000000;
      local_190 = pCVar10;
      local_188 = VVar13.t;
      if (bVar14 && (bVar1 & 1) == 0) {
        puVar2 = *(undefined8 **)(local_1b8 + lVar12);
        local_1b0 = (undefined1  [8])puVar2[6];
        local_1a8.t = *(uint *)(puVar2 + 7);
        local_1a0 = (pointer)*puVar2;
        local_198 = *(undefined4 *)(puVar2 + 1);
        local_b8._M_array = (iterator)local_1b0;
        local_b8._M_len = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_c8,&local_b8);
      }
      else {
        puVar2 = *(undefined8 **)(local_1b8 + lVar12);
        local_1b0 = (undefined1  [8])puVar2[6];
        local_1a8.t = *(uint *)(puVar2 + 7);
        local_1a0 = (pointer)*puVar2;
        local_198 = *(undefined4 *)(puVar2 + 1);
        local_180 = (ExecutionEngine *)puVar2[2];
        local_178 = *(undefined4 *)(puVar2 + 3);
        local_170 = local_130;
        local_168 = (undefined4)local_128;
        local_160 = puVar2[4];
        local_158 = *(undefined4 *)(puVar2 + 5);
        local_150 = local_108.pg;
        local_148 = local_108.i.t;
        local_b8._M_array = (iterator)local_1b0;
        local_b8._M_len = 7;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_c8,&local_b8);
      }
      local_118 = (undefined1  [8])local_c8.pg;
      local_110 = CONCAT44(local_110._4_4_,local_c8.i.t);
      expr::logistic((expr *)&local_c8,(Expression *)local_118);
      expr::operator-((expr *)&local_b8,1.0,&local_c8);
      local_a8 = (ComputationGraph *)0x0;
      local_a0 = 0;
      if (bVar14 && (bVar1 & 1) == 0) {
        lVar5 = *(long *)(local_1b8 + lVar12);
        local_1b0 = *(undefined1 (*) [8])(lVar5 + 0xa0);
        local_1a8.t = *(uint *)(lVar5 + 0xa8);
        local_1a0 = *(pointer *)(lVar5 + 0x80);
        local_198 = *(undefined4 *)(lVar5 + 0x88);
        local_1c8 = (undefined1  [8])local_1b0;
        local_1c0 = 3;
        local_190 = pCVar10;
        local_188 = VVar13.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,(initializer_list<cnn::expr::Expression> *)local_1c8);
        __x = extraout_XMM0_Qa_00;
      }
      else {
        lVar5 = *(long *)(local_1b8 + lVar12);
        local_1b0 = *(undefined1 (*) [8])(lVar5 + 0xa0);
        local_1a8.t = *(uint *)(lVar5 + 0xa8);
        local_1a0 = *(pointer *)(lVar5 + 0x80);
        local_198 = *(undefined4 *)(lVar5 + 0x88);
        local_180 = *(ExecutionEngine **)(lVar5 + 0x90);
        local_178 = *(undefined4 *)(lVar5 + 0x98);
        local_170 = local_130;
        local_168 = (undefined4)local_128;
        local_1c8 = (undefined1  [8])local_1b0;
        local_1c0 = 5;
        local_190 = pCVar10;
        local_188 = VVar13.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,(initializer_list<cnn::expr::Expression> *)local_1c8);
        __x = extraout_XMM0_Qa;
      }
      local_a8 = local_d8.pg;
      local_a0 = local_d8.i.t;
      expr::tanh((expr *)&local_d8,__x);
      if (bVar14 && (bVar1 & 1) == 0) {
        expr::cwise_multiply((expr *)local_1b0,&local_c8,&local_d8);
        lVar5 = *(long *)(local_120 + -0x18);
        *(undefined1 (*) [8])(lVar5 + lVar11) = local_1b0;
      }
      else {
        expr::cwise_multiply((expr *)local_1b0,&local_c8,&local_d8);
        expr::cwise_multiply((expr *)local_1c8,(Expression *)&local_b8,&local_108);
        expr::operator+((expr *)&local_e8,(Expression *)local_1c8,(Expression *)local_1b0);
        lVar5 = *(long *)(local_120 + -0x18);
        *(ComputationGraph **)(lVar5 + lVar11) = local_e8.pg;
        local_1a8.t = local_e8.i.t;
      }
      *(uint *)(lVar5 + 8 + lVar11) = local_1a8.t;
      local_1c8 = (undefined1  [8])0x0;
      local_1c0 = local_1c0 & 0xffffffff00000000;
      if (bVar14 && (bVar1 & 1) == 0) {
        lVar5 = *(long *)(local_1b8 + lVar12);
        local_1b0 = *(undefined1 (*) [8])(lVar5 + 0x70);
        local_1a8.t = *(uint *)(lVar5 + 0x78);
        local_1a0 = *(pointer *)(lVar5 + 0x40);
        local_198 = *(undefined4 *)(lVar5 + 0x48);
        local_f8._M_array = (iterator)local_1b0;
        local_f8._M_len = 3;
        local_190 = pCVar10;
        local_188 = VVar13.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_e8,&local_f8);
      }
      else {
        lVar5 = *(long *)(local_1b8 + lVar12);
        local_1b0 = *(undefined1 (*) [8])(lVar5 + 0x70);
        local_1a8.t = *(uint *)(lVar5 + 0x78);
        local_1a0 = *(pointer *)(lVar5 + 0x40);
        local_198 = *(undefined4 *)(lVar5 + 0x48);
        local_180 = *(ExecutionEngine **)(lVar5 + 0x50);
        local_178 = *(undefined4 *)(lVar5 + 0x58);
        local_170 = local_130;
        local_168 = (undefined4)local_128;
        local_160 = *(undefined8 *)(lVar5 + 0x60);
        local_158 = *(undefined4 *)(lVar5 + 0x68);
        local_150 = *(ComputationGraph **)(*(long *)(local_120 + -0x18) + lVar11);
        local_148 = *(uint *)(*(long *)(local_120 + -0x18) + 8 + lVar11);
        local_f8._M_array = (iterator)local_1b0;
        local_f8._M_len = 7;
        local_190 = pCVar10;
        local_188 = VVar13.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_e8,&local_f8);
      }
      lVar5 = local_138;
      local_1c8 = (undefined1  [8])local_e8.pg;
      local_1c0 = CONCAT44(local_1c0._4_4_,local_e8.i.t);
      expr::logistic((expr *)local_1b0,(Expression *)local_1c8);
      expr::tanh((expr *)&local_e8,__x_00);
      expr::cwise_multiply((expr *)&local_f8,(Expression *)local_1b0,&local_e8);
      lVar3 = *(long *)(local_40 + -0x18);
      *(iterator *)(lVar3 + lVar11) = local_f8._M_array;
      *(uint *)(lVar3 + 8 + lVar11) = (uint)local_f8._M_len;
      *(iterator *)
       ((long)&(local_90.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar11) = local_f8._M_array;
      *(uint *)((long)&((local_90.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar11) =
           (uint)local_f8._M_len;
      uVar7 = local_38 + 1;
      lVar11 = lVar11 + 0x10;
      lVar12 = lVar12 + 0x18;
      pCVar10 = (ComputationGraph *)local_f8._M_array;
      VVar13.t = (uint)local_f8._M_len;
    } while (uVar7 < *(uint *)(lVar5 + 0xd8));
  }
  EVar15 = expr::detail::
           f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                     ((detail *)local_1b0,&local_90);
  pDVar4 = local_70;
  uVar9 = EVar15._8_8_;
  *(undefined1 (*) [8])(local_78 + -0x10) = local_1b0;
  *(uint *)(local_78 + -8) = local_1a8.t;
  (local_70->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(local_78 + -0x10);
  (local_70->super_RNNBuilder).cur.t = *(int *)(local_78 + -8);
  if (local_90.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar9 = extraout_RDX;
  }
  EVar15._8_8_ = uVar9;
  EVar15.pg = (ComputationGraph *)pDVar4;
  return EVar15;
}

Assistant:

Expression DeepLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  o.push_back(Expression());
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression& ot = o.back();
  Expression in = x;
  vector<Expression> cc(layers);
  for (unsigned i = 0; i < layers; ++i) {
    if (i > 0)
      in = concatenate({in, x});
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state)
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + vars[C2I] * i_c_tm1;
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + vars[C2O] * ct[i];
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
    cc[i] = in;
  }
  ot = concatenate(cc);
  return ot;
}